

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  ulong uVar1;
  uint uVar2;
  second_type pFVar3;
  TextGenerator *pTVar4;
  bool bVar5;
  CppType CVar6;
  Type TVar7;
  LogMessage *pLVar8;
  second_type *ppFVar9;
  ulong uVar10;
  EnumDescriptor *this_00;
  string *psVar11;
  Message *local_4a8;
  uint local_45c;
  ulong local_420;
  byte local_3f9;
  undefined8 local_3e0;
  uint local_3bc;
  undefined8 local_3a0;
  uint local_37c;
  undefined8 local_360;
  uint local_33c;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  EnumValueDescriptor *local_298;
  EnumValueDescriptor *enum_desc;
  undefined1 local_288 [4];
  int enum_value;
  LogFinisher local_262;
  byte local_261;
  LogMessage local_260;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8 [8];
  string truncated_value;
  string *value_to_print;
  string *value;
  string scratch;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  FieldValuePrinter *local_98;
  second_type local_90;
  FieldValuePrinter *printer;
  byte local_71;
  LogMessage local_70;
  TextGenerator *local_38;
  TextGenerator *generator_local;
  FieldDescriptor *pFStack_28;
  int index_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  Printer *this_local;
  
  local_38 = generator;
  generator_local._4_4_ = index;
  pFStack_28 = field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  bVar5 = FieldDescriptor::is_repeated(field);
  local_71 = 0;
  if ((!bVar5) && (generator_local._4_4_ != -1)) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x6d0);
    local_71 = 1;
    pLVar8 = internal::LogMessage::operator<<
                       (&local_70,"CHECK failed: field->is_repeated() || (index == -1): ");
    pLVar8 = internal::LogMessage::operator<<(pLVar8,"Index must be -1 for non-repeated fields");
    internal::LogFinisher::operator=((LogFinisher *)((long)&printer + 3),pLVar8);
  }
  if ((local_71 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_70);
  }
  local_98 = internal::scoped_ptr<const_google::protobuf::TextFormat::FieldValuePrinter>::get
                       (&this->default_field_value_printer_);
  ppFVar9 = FindWithDefault<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::TextFormat::FieldValuePrinter_const*,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::TextFormat::FieldValuePrinter_const*>>>>
                      (&this->custom_printers_,&stack0xffffffffffffffd8,&local_98);
  local_90 = *ppFVar9;
  CVar6 = FieldDescriptor::cpp_type(pFStack_28);
  pTVar4 = local_38;
  pFVar3 = local_90;
  switch(CVar6) {
  case CPPTYPE_INT32:
    bVar5 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar5) {
      local_33c = (**(code **)(*(long *)field_local + 0x150))
                            (field_local,reflection_local,pFStack_28,generator_local._4_4_);
    }
    else {
      local_33c = (**(code **)(*(long *)field_local + 0x88))
                            (field_local,reflection_local,pFStack_28);
    }
    (*pFVar3->_vptr_FieldValuePrinter[3])(&local_b8,pFVar3,(ulong)local_33c);
    TextGenerator::Print(pTVar4,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    break;
  case CPPTYPE_INT64:
    bVar5 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar5) {
      local_360 = (**(code **)(*(long *)field_local + 0x158))
                            (field_local,reflection_local,pFStack_28,generator_local._4_4_);
    }
    else {
      local_360 = (**(code **)(*(long *)field_local + 0x90))
                            (field_local,reflection_local,pFStack_28);
    }
    (*pFVar3->_vptr_FieldValuePrinter[5])(&local_d8,pFVar3,local_360);
    TextGenerator::Print(pTVar4,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    break;
  case CPPTYPE_UINT32:
    bVar5 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar5) {
      local_37c = (**(code **)(*(long *)field_local + 0x160))
                            (field_local,reflection_local,pFStack_28,generator_local._4_4_);
    }
    else {
      local_37c = (**(code **)(*(long *)field_local + 0x98))
                            (field_local,reflection_local,pFStack_28);
    }
    (*pFVar3->_vptr_FieldValuePrinter[4])(&local_f8,pFVar3,(ulong)local_37c);
    TextGenerator::Print(pTVar4,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    break;
  case CPPTYPE_UINT64:
    bVar5 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar5) {
      local_3a0 = (**(code **)(*(long *)field_local + 0x168))
                            (field_local,reflection_local,pFStack_28,generator_local._4_4_);
    }
    else {
      local_3a0 = (**(code **)(*(long *)field_local + 0xa0))
                            (field_local,reflection_local,pFStack_28);
    }
    (*pFVar3->_vptr_FieldValuePrinter[6])(&local_118,pFVar3,local_3a0);
    TextGenerator::Print(pTVar4,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    break;
  case CPPTYPE_DOUBLE:
    bVar5 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar5) {
      local_3e0 = (**(code **)(*(long *)field_local + 0x178))
                            (field_local,reflection_local,pFStack_28,generator_local._4_4_);
    }
    else {
      local_3e0 = (**(code **)(*(long *)field_local + 0xb0))
                            (field_local,reflection_local,pFStack_28);
    }
    (*pFVar3->_vptr_FieldValuePrinter[8])(local_3e0);
    TextGenerator::Print(pTVar4,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    break;
  case CPPTYPE_FLOAT:
    bVar5 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar5) {
      local_3bc = (**(code **)(*(long *)field_local + 0x170))
                            (field_local,reflection_local,pFStack_28,generator_local._4_4_);
    }
    else {
      local_3bc = (**(code **)(*(long *)field_local + 0xa8))
                            (field_local,reflection_local,pFStack_28);
    }
    (*pFVar3->_vptr_FieldValuePrinter[7])((ulong)local_3bc);
    TextGenerator::Print(pTVar4,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    break;
  case CPPTYPE_BOOL:
    bVar5 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar5) {
      local_3f9 = (**(code **)(*(long *)field_local + 0x180))
                            (field_local,reflection_local,pFStack_28,generator_local._4_4_);
    }
    else {
      local_3f9 = (**(code **)(*(long *)field_local + 0xb8))
                            (field_local,reflection_local,pFStack_28);
    }
    psVar11 = (string *)((long)&scratch.field_2 + 8);
    (*pFVar3->_vptr_FieldValuePrinter[2])(psVar11,pFVar3,(ulong)(local_3f9 & 1));
    TextGenerator::Print(pTVar4,psVar11);
    std::__cxx11::string::~string((string *)(scratch.field_2._M_local_buf + 8));
    break;
  case CPPTYPE_ENUM:
    bVar5 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar5) {
      local_45c = (**(code **)(*(long *)field_local + 0x198))
                            (field_local,reflection_local,pFStack_28,generator_local._4_4_);
    }
    else {
      local_45c = (**(code **)(*(long *)field_local + 0xd0))
                            (field_local,reflection_local,pFStack_28);
    }
    enum_desc._4_4_ = local_45c;
    this_00 = FieldDescriptor::enum_type(pFStack_28);
    local_298 = EnumDescriptor::FindValueByNumber(this_00,enum_desc._4_4_);
    pTVar4 = local_38;
    pFVar3 = local_90;
    uVar2 = enum_desc._4_4_;
    if (local_298 == (EnumValueDescriptor *)0x0) {
      StringPrintf_abi_cxx11_(&local_2f8,"%d");
      (*pFVar3->_vptr_FieldValuePrinter[0xb])(&local_2d8,pFVar3,(ulong)uVar2,&local_2f8);
      TextGenerator::Print(pTVar4,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
    }
    else {
      psVar11 = EnumValueDescriptor::name_abi_cxx11_(local_298);
      (*pFVar3->_vptr_FieldValuePrinter[0xb])(&local_2b8,pFVar3,(ulong)uVar2,psVar11);
      TextGenerator::Print(pTVar4,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    break;
  case CPPTYPE_STRING:
    std::__cxx11::string::string((string *)&value);
    bVar5 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar5) {
      local_420 = (**(code **)(*(long *)field_local + 0x1a8))
                            (field_local,reflection_local,pFStack_28,generator_local._4_4_,&value);
    }
    else {
      local_420 = (**(code **)(*(long *)field_local + 0xe0))
                            (field_local,reflection_local,pFStack_28,&value);
    }
    truncated_value.field_2._8_8_ = local_420;
    std::__cxx11::string::string(local_1c8);
    if ((0 < this->truncate_string_field_longer_than_) &&
       (uVar1 = this->truncate_string_field_longer_than_, uVar10 = std::__cxx11::string::size(),
       uVar1 < uVar10)) {
      std::__cxx11::string::substr((ulong)&local_208,local_420);
      std::operator+(&local_1e8,&local_208,"...<truncated>...");
      std::__cxx11::string::operator=(local_1c8,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      truncated_value.field_2._8_8_ = local_1c8;
    }
    TVar7 = FieldDescriptor::type(pFStack_28);
    pTVar4 = local_38;
    if (TVar7 == TYPE_STRING) {
      (*local_90->_vptr_FieldValuePrinter[9])(&local_228,local_90,truncated_value.field_2._8_8_);
      TextGenerator::Print(pTVar4,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
    }
    else {
      local_261 = 0;
      TVar7 = FieldDescriptor::type(pFStack_28);
      if (TVar7 != TYPE_BYTES) {
        internal::LogMessage::LogMessage
                  (&local_260,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
                   ,0x6f9);
        local_261 = 1;
        pLVar8 = internal::LogMessage::operator<<
                           (&local_260,
                            "CHECK failed: (field->type()) == (FieldDescriptor::TYPE_BYTES): ");
        internal::LogFinisher::operator=(&local_262,pLVar8);
      }
      if ((local_261 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_260);
      }
      pTVar4 = local_38;
      (*local_90->_vptr_FieldValuePrinter[10])(local_288,local_90,truncated_value.field_2._8_8_);
      TextGenerator::Print(pTVar4,(string *)local_288);
      std::__cxx11::string::~string((string *)local_288);
    }
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string((string *)&value);
    break;
  case CPPTYPE_MESSAGE:
    bVar5 = FieldDescriptor::is_repeated(pFStack_28);
    if (bVar5) {
      local_4a8 = (Message *)
                  (**(code **)(*(long *)field_local + 0x1a0))
                            (field_local,reflection_local,pFStack_28,generator_local._4_4_);
    }
    else {
      local_4a8 = (Message *)
                  (**(code **)(*(long *)field_local + 0xd8))
                            (field_local,reflection_local,pFStack_28,0);
    }
    Print(this,local_4a8,local_38);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(
    const Message& message,
    const Reflection* reflection,
    const FieldDescriptor* field,
    int index,
    TextGenerator& generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FieldValuePrinter* printer
      = FindWithDefault(custom_printers_, field,
                        default_field_value_printer_.get());

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                   \
    case FieldDescriptor::CPPTYPE_##CPPTYPE:                            \
      generator.Print(printer->Print##METHOD(field->is_repeated()       \
               ? reflection->GetRepeated##METHOD(message, field, index) \
               : reflection->Get##METHOD(message, field)));             \
        break

    OUTPUT_FIELD( INT32,  Int32);
    OUTPUT_FIELD( INT64,  Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD( FLOAT,  Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(  BOOL,   Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      string scratch;
      const string& value = field->is_repeated()
          ? reflection->GetRepeatedStringReference(
              message, field, index, &scratch)
          : reflection->GetStringReference(message, field, &scratch);
      const string* value_to_print = &value;
      string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          truncate_string_field_longer_than_ < value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        generator.Print(printer->PrintString(*value_to_print));
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        generator.Print(printer->PrintBytes(*value_to_print));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value = field->is_repeated()
          ? reflection->GetRepeatedEnumValue(message, field, index)
          : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != NULL) {
        generator.Print(printer->PrintEnum(enum_value, enum_desc->name()));
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        generator.Print(printer->PrintEnum(enum_value,
                                           StringPrintf("%d", enum_value)));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
            ? reflection->GetRepeatedMessage(message, field, index)
            : reflection->GetMessage(message, field),
            generator);
      break;
  }
}